

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O3

int StopThreadIM483Ix(IM483I *pIM483I)

{
  CRITICAL_SECTION *__mutex;
  long lVar1;
  
  __mutex = IM483ICS;
  lVar1 = 0;
  do {
    if (*(IM483I **)((long)addrsIM483I + lVar1 * 2) == pIM483I) {
      *(undefined4 *)((long)bExitIM483I + lVar1) = 1;
      pthread_join(*(pthread_t *)((long)IM483IThreadId + lVar1 * 2),(void **)0x0);
      pthread_mutex_destroy((pthread_mutex_t *)__mutex);
      *(undefined4 *)((long)resIM483I + lVar1) = 1;
      return 0;
    }
    lVar1 = lVar1 + 4;
    __mutex = __mutex + 1;
  } while (lVar1 != 0x40);
  return 1;
}

Assistant:

HARDWAREX_API int StopThreadIM483Ix(IM483I* pIM483I)
{
	int id = 0;

	while (addrsIM483I[id] != pIM483I)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	bExitIM483I[id] = TRUE;
	WaitForThread(IM483IThreadId[id]);
	DeleteCriticalSection(&IM483ICS[id]);
	resIM483I[id] = EXIT_FAILURE;
	return EXIT_SUCCESS;
}